

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  DecodeStatus DVar3;
  void *Decoder_00;
  uint64_t Address_00;
  uint RegNo;
  
  RegNo = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  if ((Insn & 0x40) == 0) {
    DVar1 = DecodeDPRRegisterClass(Inst,RegNo,Address,Decoder);
  }
  else {
    DVar1 = DecodeQPRRegisterClass(Inst,RegNo,Address,Decoder);
  }
  if ((DVar1 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  MCOperand_CreateImm0
            (Inst,(ulong)(Insn & 0xf0f | Insn >> 0xc & 0x70 | Insn >> 0x11 & 0x80 |
                         (Insn & 0x20) << 7));
  uVar2 = MCInst_getOpcode(Inst);
  Decoder_00 = (void *)(ulong)(uVar2 - 599);
  if (1 < uVar2 - 599) {
    Decoder_00 = (void *)(ulong)(uVar2 - 0x259);
    if ((uVar2 - 0x259 < 2) || (Decoder_00 = (void *)(ulong)(uVar2 - 0x5a4), uVar2 - 0x5a4 < 2)) {
      DVar3 = DecodeQPRRegisterClass(Inst,RegNo,Address_00,Decoder_00);
      goto LAB_001500f2;
    }
    if (1 < uVar2 - 0x5a2) {
      return DVar1;
    }
  }
  DVar3 = DecodeDPRRegisterClass(Inst,RegNo,Address_00,Decoder_00);
LAB_001500f2:
  if (DVar3 == MCDisassembler_Success) {
    return DVar1;
  }
  if (DVar3 != MCDisassembler_SoftFail) {
    return MCDisassembler_Fail;
  }
  return MCDisassembler_SoftFail;
}

Assistant:

static DecodeStatus DecodeNEONModImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned imm, Q;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	imm = fieldFromInstruction_4(Insn, 0, 4);
	imm |= fieldFromInstruction_4(Insn, 16, 3) << 4;
	imm |= fieldFromInstruction_4(Insn, 24, 1) << 7;
	imm |= fieldFromInstruction_4(Insn, 8, 4) << 8;
	imm |= fieldFromInstruction_4(Insn, 5, 1) << 12;
	Q = fieldFromInstruction_4(Insn, 6, 1);

	if (Q) {
		if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	} else {
		if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		case ARM_VORRiv4i16:
		case ARM_VORRiv2i32:
		case ARM_VBICiv4i16:
		case ARM_VBICiv2i32:
			if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		case ARM_VORRiv8i16:
		case ARM_VORRiv4i32:
		case ARM_VBICiv8i16:
		case ARM_VBICiv4i32:
			if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
				return MCDisassembler_Fail;
			break;
		default:
			break;
	}

	return S;
}